

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void poly3_span_add(poly3_span *out,poly3_span *a,poly3_span *b,size_t n)

{
  crypto_word_t *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  size_t sVar5;
  ulong uVar6;
  
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    pcVar1 = out->a;
    uVar2 = a->a[sVar5];
    uVar3 = b->s[sVar5];
    uVar4 = b->a[sVar5];
    uVar6 = a->s[sVar5] ^ uVar4;
    out->s[sVar5] = (uVar3 ^ uVar2) & uVar6;
    pcVar1[sVar5] = uVar6 ^ uVar3 | uVar4 ^ uVar2;
  }
  return;
}

Assistant:

static void poly3_span_add(const struct poly3_span *out,
                           const struct poly3_span *a,
                           const struct poly3_span *b, size_t n) {
  for (size_t i = 0; i < n; i++) {
    poly3_word_add(&out->s[i], &out->a[i], a->s[i], a->a[i], b->s[i], b->a[i]);
  }
}